

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUISpriteBank::addTextureAsSprite(CGUISpriteBank *this,ITexture *texture)

{
  pointer prVar1;
  pointer prVar2;
  int iVar3;
  s32 sVar4;
  SGUISpriteFrame local_60;
  SGUISprite local_58;
  
  if (texture == (ITexture *)0x0) {
    sVar4 = -1;
  }
  else {
    (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[4])();
    iVar3 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])(this);
    prVar1 = (this->Rectangles).m_data.
             super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    prVar2 = (this->Rectangles).m_data.
             super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_finish = *(pointer *)&texture->OriginalSize;
    core::array<irr::core::rect<int>_>::push_back(&this->Rectangles,(rect<int> *)&local_58);
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.Frames.m_data.
    super__Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.Frames.is_sorted = true;
    local_58.frameTime = 0;
    local_60.rectNumber = (u32)((ulong)((long)prVar1 - (long)prVar2) >> 4);
    local_60.textureNumber = iVar3 - 1;
    core::array<irr::gui::SGUISpriteFrame>::push_back(&local_58.Frames,&local_60);
    core::array<irr::gui::SGUISprite>::push_back
              ((array<irr::gui::SGUISprite> *)&(this->super_IGUISpriteBank).field_0x8,&local_58);
    sVar4 = (int)((*(long *)&(this->super_IGUISpriteBank).field_0x10 -
                  *(long *)&(this->super_IGUISpriteBank).field_0x8) / 0x28) + -1;
    ::std::_Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>::
    ~_Vector_base((_Vector_base<irr::gui::SGUISpriteFrame,_std::allocator<irr::gui::SGUISpriteFrame>_>
                   *)&local_58);
  }
  return sVar4;
}

Assistant:

s32 CGUISpriteBank::addTextureAsSprite(video::ITexture *texture)
{
	if (!texture)
		return -1;

	addTexture(texture);
	u32 textureIndex = getTextureCount() - 1;

	u32 rectangleIndex = Rectangles.size();
	Rectangles.push_back(core::rect<s32>(0, 0, texture->getOriginalSize().Width, texture->getOriginalSize().Height));

	SGUISprite sprite;
	sprite.frameTime = 0;

	SGUISpriteFrame frame;
	frame.textureNumber = textureIndex;
	frame.rectNumber = rectangleIndex;
	sprite.Frames.push_back(frame);

	Sprites.push_back(sprite);

	return Sprites.size() - 1;
}